

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_AddCommonExprs_Test::TestBody(ProblemTest_AddCommonExprs_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  int iVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Problem p;
  type *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  int *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  char *expected_expression;
  int line;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffc40;
  Type in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  undefined4 uVar4;
  AssertionResult local_3a8;
  Type in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffc70;
  AssertionResult local_380;
  Message *in_stack_fffffffffffffc98;
  AssertHelper *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffd0c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffd10;
  
  expected_expression = &stack0xfffffffffffffca0;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(in_stack_fffffffffffffc40);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVars
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::num_common_exprs
            ((BasicProblem<mp::BasicProblemParams<int>_> *)0x12b149);
  testing::internal::EqHelper<true>::Compare<int,int>
            (expected_expression,
             (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
             in_stack_fffffffffffffc28,
             (int *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             in_stack_fffffffffffffc18);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
  if (!(bool)uVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    in_stack_fffffffffffffc28 =
         (int *)testing::AssertionResult::failure_message((AssertionResult *)0x12b1d7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               in_stack_fffffffffffffc4c,(char *)in_stack_fffffffffffffc40,
               (int)((ulong)expected_expression >> 0x20),
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffc30));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    testing::Message::~Message((Message *)0x12b225);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12b26b);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExprs
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
  uVar4 = 2;
  iVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_common_exprs
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)0x12b294);
  testing::internal::EqHelper<false>::Compare<int,int>
            (expected_expression,(char *)CONCAT17(uVar1,in_stack_fffffffffffffc30),
             in_stack_fffffffffffffc28,
             (int *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  line = (int)((ulong)expected_expression >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT44(uVar4,iVar3));
    testing::AssertionResult::failure_message((AssertionResult *)0x12b316);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,iVar3),in_stack_fffffffffffffc4c,
               (char *)in_stack_fffffffffffffc40,line,
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffc30));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffc20));
    testing::Message::~Message((Message *)0x12b362);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12b3a8);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)CONCAT17(uVar2,in_stack_fffffffffffffc20)
            );
  return;
}

Assistant:

TEST(ProblemTest, AddCommonExprs) {
  Problem p;
  p.AddVars(1, mp::var::CONTINUOUS);
  EXPECT_EQ(0, p.num_common_exprs());
  p.AddCommonExprs(2);
  EXPECT_EQ(2, p.num_common_exprs());
}